

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSwizzleTests.cpp
# Opt level: O0

void gl3cts::TextureSwizzle::calculate_expected_value
               (size_t source_format_idx,size_t output_format_idx,size_t index_of_swizzled_channel,
               GLint source_size,GLint output_size,void *out_expected_data_low,
               void *out_expected_data_top,size_t *out_expected_data_size)

{
  void *__src;
  bool bVar1;
  _out_ch_desc *p_Var2;
  TestError *pTVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  double dVar7;
  double dVar8;
  double stor_output_top;
  double stor_output_low;
  float temp_output_top;
  float temp_output_low;
  float read_internal_top;
  float read_internal_low;
  float stor_internal_top;
  float stor_internal_low;
  float temp_internal;
  float max_output;
  float max_internal;
  double ch_rgba [4];
  size_t local_70;
  size_t texel_size;
  double range_top;
  double range_low;
  bool is_signed;
  GLvoid *expected_data;
  _out_ch_desc *desc;
  _texture_format *source_format;
  _texture_format *output_format;
  void *out_expected_data_low_local;
  GLint output_size_local;
  GLint source_size_local;
  size_t index_of_swizzled_channel_local;
  size_t output_format_idx_local;
  size_t source_format_idx_local;
  
  p_Var2 = get_descriptor_for_channel
                     ((_texture_format *)(texture_formats + source_format_idx * 0x78),
                      index_of_swizzled_channel);
  __src = p_Var2->m_expected_data;
  bVar1 = false;
  range_top = 0.0;
  texel_size = 0;
  switch(*(undefined4 *)(texture_formats + output_format_idx * 0x78 + 0xc)) {
  case 0x1400:
    bVar1 = true;
    range_top = -127.0;
    texel_size = 0x405fc00000000000;
    local_70 = 1;
    break;
  case 0x1401:
    range_top = 0.0;
    texel_size = 0x406fe00000000000;
    local_70 = 1;
    break;
  case 0x1402:
    bVar1 = true;
    range_top = -32767.0;
    texel_size = 0x40dfffc000000000;
    local_70 = 2;
    break;
  case 0x1403:
    range_top = 0.0;
    texel_size = 0x40efffe000000000;
    local_70 = 2;
    break;
  case 0x1404:
    bVar1 = true;
    range_top = -2147483647.0;
    texel_size = 0x41dfffffffc00000;
    local_70 = 4;
    break;
  case 0x1405:
    range_top = 0.0;
    texel_size = 0x41efffffffe00000;
    local_70 = 4;
    break;
  case 0x1406:
    local_70 = 4;
    break;
  default:
    pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar3,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
               ,0x6be);
    __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  case 0x140b:
    local_70 = 2;
  }
  out_expected_data_low_local._0_4_ = output_size;
  out_expected_data_low_local._4_4_ = source_size;
  if (bVar1) {
    out_expected_data_low_local._4_4_ = source_size + -1;
    out_expected_data_low_local._0_4_ = output_size + -1;
  }
  if (__src == (void *)0x0) {
    calculate_values_from_source(source_format_idx,(double *)&max_output);
    dVar7 = calculate_max_for_size((long)out_expected_data_low_local._4_4_);
    fVar4 = (float)dVar7;
    dVar8 = calculate_max_for_size((long)(GLint)out_expected_data_low_local);
    dVar7 = *(double *)(&max_output + index_of_swizzled_channel * 2);
    fVar5 = ::deFloatFloor((float)dVar7 * fVar4 - 1.0);
    fVar6 = ::deFloatCeil((float)dVar7 * fVar4 + 1.0);
    dVar7 = std::floor((double)(ulong)(uint)((fVar5 / fVar4) * (float)dVar8));
    dVar8 = std::ceil((double)(ulong)(uint)((fVar6 / fVar4) * (float)dVar8));
    dVar7 = de::clamp<double>((double)SUB84(dVar7,0),range_top,(double)texel_size);
    dVar8 = de::clamp<double>((double)SUB84(dVar8,0),range_top,(double)texel_size);
    switch(*(undefined4 *)(texture_formats + output_format_idx * 0x78 + 0xc)) {
    case 0x1400:
      convert<signed_char>(out_expected_data_low,dVar7);
      convert<signed_char>(out_expected_data_top,dVar8);
      break;
    case 0x1401:
      convert<unsigned_char>(out_expected_data_low,dVar7);
      convert<unsigned_char>(out_expected_data_top,dVar8);
      break;
    case 0x1402:
      convert<short>(out_expected_data_low,dVar7);
      convert<short>(out_expected_data_top,dVar8);
      break;
    case 0x1403:
      convert<unsigned_short>(out_expected_data_low,dVar7);
      convert<unsigned_short>(out_expected_data_top,dVar8);
      break;
    case 0x1404:
      convert<int>(out_expected_data_low,dVar7);
      convert<int>(out_expected_data_top,dVar8);
      break;
    case 0x1405:
      convert<unsigned_int>(out_expected_data_low,dVar7);
      convert<unsigned_int>(out_expected_data_top,dVar8);
      break;
    default:
      pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar3,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                 ,0x705);
      __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    *out_expected_data_size = local_70;
  }
  else {
    memcpy(out_expected_data_top,__src,local_70);
    memcpy(out_expected_data_low,__src,local_70);
    *out_expected_data_size = local_70;
  }
  return;
}

Assistant:

void calculate_expected_value(size_t source_format_idx, size_t output_format_idx, size_t index_of_swizzled_channel,
							  glw::GLint source_size, glw::GLint output_size, void* out_expected_data_low,
							  void* out_expected_data_top, size_t& out_expected_data_size)
{
	const _texture_format& output_format = texture_formats[output_format_idx];
	const _texture_format& source_format = texture_formats[source_format_idx];
	const _out_ch_desc&	desc			 = get_descriptor_for_channel(source_format, index_of_swizzled_channel);
	const glw::GLvoid*	 expected_data = desc.m_expected_data;
	bool				   is_signed	 = false;
	double				   range_low	 = 0.0f;
	double				   range_top	 = 0.0f;
	size_t				   texel_size	= 0;

	/* Select range, texel size and is_signed */
	switch (output_format.m_type)
	{
	case GL_BYTE:
		is_signed = true;

		range_low = -127.0;
		range_top = 127.0;

		texel_size = 1;

		break;

	case GL_UNSIGNED_BYTE:
		range_low = 0.0;
		range_top = 255.0;

		texel_size = 1;

		break;

	case GL_SHORT:
		is_signed = true;

		range_low = -32767.0;
		range_top = 32767.0;

		texel_size = 2;

		break;

	case GL_UNSIGNED_SHORT:
		range_low = 0.0;
		range_top = 65535.0;

		texel_size = 2;

		break;

	case GL_HALF_FLOAT:
		texel_size = 2;

		/* Halfs are not calculated, range will not be used */

		break;

	case GL_INT:
		is_signed = true;

		range_low = -2147483647.0;
		range_top = 2147483647.0;

		texel_size = 4;

		break;

	case GL_UNSIGNED_INT:
		range_low = 0.0;
		range_top = 4294967295.0;

		texel_size = 4;

		break;

	case GL_FLOAT:
		texel_size = 4;

		/* Float are not calculated, range will not be used */

		break;

	default:
		TCU_FAIL("Invalid enum");
		break;
	}

	/* Signed formats use one bit less */
	if (true == is_signed)
	{
		source_size -= 1;
		output_size -= 1;
	}

	/* If expected data is hardcoded just copy data to low and top */
	if (DE_NULL != expected_data)
	{
		memcpy(out_expected_data_top, expected_data, texel_size);
		memcpy(out_expected_data_low, expected_data, texel_size);
		out_expected_data_size = texel_size;
	}
	else
	{
		/* Get source values */
		double ch_rgba[4];
		calculate_values_from_source(source_format_idx, ch_rgba);

		/* Calculate expected value */
		const float max_internal  = float(calculate_max_for_size(source_size));
		const float max_output	= float(calculate_max_for_size(output_size));
		const float temp_internal = float(ch_rgba[index_of_swizzled_channel]) * max_internal;
		const float stor_internal_low =
			deFloatFloor(temp_internal - 1.0f); /* Offset by 1 to avoid rounding done by FPU */
		const float stor_internal_top =
			deFloatCeil(temp_internal + 1.0f); /* Offset by 1 to avoid rounding done by FPU */
		const float read_internal_low = stor_internal_low / max_internal;
		const float read_internal_top = stor_internal_top / max_internal;
		const float temp_output_low   = read_internal_low * max_output;
		const float temp_output_top   = read_internal_top * max_output;
		double		stor_output_low   = floor(temp_output_low);
		double		stor_output_top   = ceil(temp_output_top);

		/* Clamp to limits of output format */
		stor_output_low = de::clamp(stor_output_low, range_low, range_top);
		stor_output_top = de::clamp(stor_output_top, range_low, range_top);

		/* Store resuts */
		switch (output_format.m_type)
		{
		case GL_BYTE:
			convert<glw::GLbyte>(out_expected_data_low, stor_output_low);
			convert<glw::GLbyte>(out_expected_data_top, stor_output_top);
			break;
		case GL_UNSIGNED_BYTE:
			convert<glw::GLubyte>(out_expected_data_low, stor_output_low);
			convert<glw::GLubyte>(out_expected_data_top, stor_output_top);
			break;
		case GL_SHORT:
			convert<glw::GLshort>(out_expected_data_low, stor_output_low);
			convert<glw::GLshort>(out_expected_data_top, stor_output_top);
			break;
		case GL_UNSIGNED_SHORT:
			convert<glw::GLushort>(out_expected_data_low, stor_output_low);
			convert<glw::GLushort>(out_expected_data_top, stor_output_top);
			break;
		case GL_INT:
			convert<glw::GLint>(out_expected_data_low, stor_output_low);
			convert<glw::GLint>(out_expected_data_top, stor_output_top);
			break;
		case GL_UNSIGNED_INT:
			convert<glw::GLuint>(out_expected_data_low, stor_output_low);
			convert<glw::GLuint>(out_expected_data_top, stor_output_top);
			break;
		default:
			TCU_FAIL("Invalid enum");
			break;
		}
		out_expected_data_size = texel_size;
	}
}